

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

pointer __thiscall
gmlc::networking::TcpConnection::create
          (TcpConnection *this,SocketFactory *sf,io_context *io_context,string *connection,
          string *port,size_t bufferSize)

{
  element_type *peVar1;
  pointer pcVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TcpConnection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pVar6;
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = (TcpConnection *)operator_new(0x240);
  TcpConnection(this_00,sf,io_context,bufferSize);
  std::__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<gmlc::networking::TcpConnection,void>
            ((__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)this,
             this_00);
  peVar1 = (((this->super_enable_shared_from_this<gmlc::networking::TcpConnection>)._M_weak_this.
             super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = (connection->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + connection->_M_string_length);
  pcVar2 = (port->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + port->_M_string_length);
  peVar3 = (this->super_enable_shared_from_this<gmlc::networking::TcpConnection>)._M_weak_this.
           super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->super_enable_shared_from_this<gmlc::networking::TcpConnection>)._M_weak_this.
           super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98 = (undefined8 *)0x0;
  uStack_90 = 0;
  local_98 = (undefined8 *)operator_new(0x10);
  *local_98 = peVar3;
  local_98[1] = p_Var4;
  pcStack_80 = std::
               _Function_handler<void_(const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpConnection.cpp:257:27)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpConnection.cpp:257:27)>
             ::_M_manager;
  (**(code **)((long)peVar1->_vptr_Socket + 0x28))(peVar1,local_50,local_70);
  _Var5._M_pi = extraout_RDX;
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
    _Var5._M_pi = extraout_RDX_00;
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
    _Var5._M_pi = extraout_RDX_01;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    _Var5._M_pi = extraout_RDX_02;
  }
  pVar6.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  pVar6.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (pointer)pVar6.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer TcpConnection::create(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& connection,
    const std::string& port,
    size_t bufferSize)
{
    auto ptr = pointer(new TcpConnection(sf, io_context, bufferSize));

    ptr->socket_->async_connect(
        connection, port, [ptr](const std::error_code& error) {
            ptr->connect_handler(error);
        });
    return ptr;
}